

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

void __thiscall testing::internal::MatcherBase<int>::~MatcherBase(MatcherBase<int> *this)

{
  (this->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00157898;
  Destroy(this);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }